

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O3

cio_error cio_buffered_stream_read_until
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,char *delim,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  undefined4 in_EAX;
  int iVar1;
  size_t sVar2;
  cio_error cVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(buffered_stream == (cio_buffered_stream *)0x0);
  auVar4._4_4_ = -(uint)(buffer == (cio_read_buffer *)0x0);
  auVar4._8_4_ = -(uint)(handler == (cio_buffered_stream_read_handler_t)0x0);
  auVar4._12_4_ = -(uint)(delim == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar4);
  if (iVar1 == 0) {
    (buffered_stream->read_info).until.delim = delim;
    sVar2 = strlen(delim);
    (buffered_stream->read_info).until.delim_length = sVar2;
    buffered_stream->read_job = internal_read_until;
    buffered_stream->read_buffer = buffer;
    buffered_stream->read_handler = handler;
    buffered_stream->read_handler_context = handler_context;
    buffered_stream->last_error = CIO_SUCCESS;
    cVar3 = CIO_SUCCESS;
    if (buffered_stream->callback_is_running == 0) {
      run_read(buffered_stream);
    }
  }
  else {
    cVar3 = CIO_INVALID_ARGUMENT;
  }
  return cVar3;
}

Assistant:

enum cio_error cio_buffered_stream_read_until(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, const char *delim, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (buffer == NULL) || (handler == NULL) || (delim == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->read_info.until.delim = delim;
	buffered_stream->read_info.until.delim_length = strlen(delim);
	buffered_stream->read_job = internal_read_until;
	buffered_stream->read_buffer = buffer;
	buffered_stream->read_handler = handler;
	buffered_stream->read_handler_context = handler_context;
	buffered_stream->last_error = CIO_SUCCESS;
	start_read(buffered_stream);

	return CIO_SUCCESS;
}